

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMU_PUBLIC_PARMS_Unmarshal
                 (TPMU_PUBLIC_PARMS *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  
  if ((int)selector < 0x23) {
    if (selector == 1) {
      TVar3 = TPMT_SYM_DEF_OBJECT_Unmarshal
                        ((TPMT_SYM_DEF_OBJECT *)&target->keyedHashDetail,buffer,size,1);
      if (TVar3 == 0) {
        TVar3 = TPMT_RSA_SCHEME_Unmarshal(&(target->rsaDetail).scheme,buffer,size,1);
        if (TVar3 == 0) {
          TVar3 = TPMI_RSA_KEY_BITS_Unmarshal(&(target->rsaDetail).keyBits,buffer,size);
          if (TVar3 == 0) {
            iVar1 = *size;
            *size = iVar1 + -4;
            TVar3 = 0x9a;
            if (3 < iVar1) {
              UVar2 = ByteArrayToUint32(*buffer);
              (target->rsaDetail).exponent = UVar2;
              *buffer = *buffer + 4;
              TVar3 = 0;
            }
          }
        }
      }
      return TVar3;
    }
    if (selector == 8) {
      TVar3 = TPMT_KEYEDHASH_SCHEME_Unmarshal(&(target->keyedHashDetail).scheme,buffer,size,1);
      return TVar3;
    }
  }
  else {
    if (selector == 0x23) {
      TVar3 = TPMT_SYM_DEF_OBJECT_Unmarshal
                        ((TPMT_SYM_DEF_OBJECT *)&target->keyedHashDetail,buffer,size,1);
      if (TVar3 == 0) {
        TVar3 = TPMT_ECC_SCHEME_Unmarshal(&(target->eccDetail).scheme,buffer,size,1);
        if (TVar3 == 0) {
          TVar3 = TPMI_ECC_CURVE_Unmarshal(&(target->eccDetail).curveID,buffer,size);
          if (TVar3 == 0) {
            TVar3 = TPMT_KDF_SCHEME_Unmarshal(&(target->eccDetail).kdf,buffer,size,1);
            return TVar3;
          }
        }
      }
      return TVar3;
    }
    if (selector == 0x25) {
      TVar3 = TPMT_SYM_DEF_OBJECT_Unmarshal
                        ((TPMT_SYM_DEF_OBJECT *)&target->keyedHashDetail,buffer,size,0);
      return TVar3;
    }
  }
  return 0x98;
}

Assistant:

TPM_RC
TPMU_PUBLIC_PARMS_Unmarshal(TPMU_PUBLIC_PARMS *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPMS_KEYEDHASH_PARMS_Unmarshal((TPMS_KEYEDHASH_PARMS *)&(target->keyedHashDetail), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPMS_SYMCIPHER_PARMS_Unmarshal((TPMS_SYMCIPHER_PARMS *)&(target->symDetail), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPMS_RSA_PARMS_Unmarshal((TPMS_RSA_PARMS *)&(target->rsaDetail), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_PARMS_Unmarshal((TPMS_ECC_PARMS *)&(target->eccDetail), buffer, size);
#endif // ALG_ECC
    }
    return TPM_RC_SELECTOR;
}